

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::SourceCodeInfo_Location_const*>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::SourceCodeInfo_Location_const*>>>
::emplace_at<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string&&>,std::tuple<>>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::SourceCodeInfo_Location_const*>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::SourceCodeInfo_Location_const*>>>
           *this,iterator iter,piecewise_construct_t *args,
          tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
          *args_1,tuple<> *args_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer pcVar3;
  long lVar4;
  bool bVar5;
  reference key;
  iterator local_40;
  iterator local_30;
  iterator local_20;
  
  local_40.field_1 = iter.field_1;
  local_40.ctrl_ = iter.ctrl_;
  pbVar2 = (args_1->
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
           ).
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&,_false>
           ._M_head_impl;
  *(size_type **)local_40.field_1.slot_ = (size_type *)((long)local_40.field_1.slot_ + 0x10);
  pcVar3 = (pbVar2->_M_dataplus)._M_p;
  paVar1 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    lVar4 = *(long *)((long)&pbVar2->field_2 + 8);
    *(size_type *)((long)local_40.field_1.slot_ + 0x10) = paVar1->_M_allocated_capacity;
    *(long *)((long)local_40.field_1.slot_ + 0x18) = lVar4;
  }
  else {
    *(pointer *)local_40.field_1.slot_ = pcVar3;
    *(size_type *)((long)local_40.field_1.slot_ + 0x10) = paVar1->_M_allocated_capacity;
  }
  *(size_type *)((long)local_40.field_1.slot_ + 8) = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  *(long *)((long)local_40.field_1.slot_ + 0x20) = 0;
  key = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::SourceCodeInfo_Location_*>_>_>
        ::iterator::operator*(&local_40);
  local_20 = find<std::__cxx11::string>(this,&key->first);
  local_30.ctrl_ = local_40.ctrl_;
  local_30.field_1.slot_ = (slot_type *)local_40.field_1;
  bVar5 = container_internal::operator==(&local_20,&local_30);
  if (bVar5) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xf3f,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, const google::protobuf::SourceCodeInfo_Location *>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::SourceCodeInfo_Location *>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, const google::protobuf::SourceCodeInfo_Location *>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::SourceCodeInfo_Location *>>, Args = <const std::piecewise_construct_t &, std::tuple<std::basic_string<char> &&>, std::tuple<>>]"
               );
}

Assistant:

void emplace_at(iterator iter, Args&&... args) {
    construct(iter.slot(), std::forward<Args>(args)...);

    assert(PolicyTraits::apply(FindElement{*this}, *iter) == iter &&
           "constructed value does not match the lookup key");
  }